

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O3

void __thiscall
slang::ast::Statement::visit<slang::ast::UnrollVisitor&>(Statement *this,UnrollVisitor *visitor)

{
  size_type sVar1;
  pointer ppEVar2;
  logic_error *this_00;
  long *plVar3;
  long lVar4;
  size_type *psVar5;
  long *plVar6;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  do {
    lVar4 = 0x28;
    switch((((ForLoopStatement *)this)->super_Statement).kind) {
    case Invalid:
    case Empty:
    case VariableDeclaration:
    case Return:
    case Continue:
    case Break:
    case Disable:
    case DisableFork:
    case WaitFork:
    case EventTrigger:
    case ProceduralAssign:
    case ProceduralDeassign:
    case RandSequence:
      return;
    case List:
      sVar1 = (((ForLoopStatement *)this)->initializers).size_;
      if (sVar1 == 0) {
        return;
      }
      ppEVar2 = (((ForLoopStatement *)this)->initializers).data_;
      lVar4 = 0;
      do {
        visit<slang::ast::UnrollVisitor&>(*(Statement **)((long)ppEVar2 + lVar4),visitor);
        lVar4 = lVar4 + 8;
      } while (sVar1 << 3 != lVar4);
      return;
    case Block:
    case ForeverLoop:
      lVar4 = 0x20;
      break;
    case ExpressionStatement:
      UnrollVisitor::handle(visitor,(ExpressionStatement *)this);
      return;
    case Conditional:
      UnrollVisitor::handle(visitor,(ConditionalStatement *)this);
      return;
    case Case:
      CaseStatement::visitStmts<slang::ast::UnrollVisitor&>((CaseStatement *)this,visitor);
      return;
    case PatternCase:
      PatternCaseStatement::visitStmts<slang::ast::UnrollVisitor&>
                ((PatternCaseStatement *)this,visitor);
      return;
    case ForLoop:
      UnrollVisitor::handle(visitor,(ForLoopStatement *)this);
      return;
    case RepeatLoop:
    case WhileLoop:
    case DoWhileLoop:
    case Timed:
    case Wait:
      break;
    case ForeachLoop:
      lVar4 = 0x38;
      break;
    case ImmediateAssertion:
      ImmediateAssertionStatement::visitStmts<slang::ast::UnrollVisitor&>
                ((ImmediateAssertionStatement *)this,visitor);
      return;
    case ConcurrentAssertion:
      ConcurrentAssertionStatement::visitStmts<slang::ast::UnrollVisitor&>
                ((ConcurrentAssertionStatement *)this,visitor);
      return;
    case WaitOrder:
      WaitOrderStatement::visitStmts<slang::ast::UnrollVisitor&>((WaitOrderStatement *)this,visitor)
      ;
      return;
    case RandCase:
      RandCaseStatement::visitStmts<slang::ast::UnrollVisitor&>((RandCaseStatement *)this,visitor);
      return;
    default:
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
                 ,"");
      plVar3 = (long *)std::__cxx11::string::append((char *)local_d0);
      local_b0._M_dataplus._M_p = (pointer)*plVar3;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar5) {
        local_b0.field_2._M_allocated_capacity = *psVar5;
        local_b0.field_2._8_8_ = plVar3[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar5;
      }
      local_b0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x10e);
      std::operator+(&local_50,&local_b0,&local_70);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (long *)*plVar3;
      plVar6 = plVar3 + 2;
      if (local_90 == plVar6) {
        local_80 = *plVar6;
        lStack_78 = plVar3[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar6;
      }
      local_88 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_f0 = (long *)*plVar3;
      plVar6 = plVar3 + 2;
      if (local_f0 == plVar6) {
        local_e0 = *plVar6;
        lStack_d8 = plVar3[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar6;
      }
      local_e8 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    this = *(Statement **)((long)&(((ForLoopStatement *)this)->super_Statement).kind + lVar4);
  } while( true );
}

Assistant:

decltype(auto) Statement::visit(TVisitor&& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case StatementKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case StatementKind::Invalid: return visitor.visitInvalid(*this, std::forward<Args>(args)...);
        CASE(Empty, EmptyStatement);
        CASE(List, StatementList);
        CASE(Block, BlockStatement);
        CASE(ExpressionStatement, ExpressionStatement);
        CASE(VariableDeclaration, VariableDeclStatement);
        CASE(Return, ReturnStatement);
        CASE(Break, BreakStatement);
        CASE(Continue, ContinueStatement);
        CASE(Disable, DisableStatement);
        CASE(Conditional, ConditionalStatement);
        CASE(Case, CaseStatement);
        CASE(PatternCase, PatternCaseStatement);
        CASE(ForLoop, ForLoopStatement);
        CASE(RepeatLoop, RepeatLoopStatement);
        CASE(ForeachLoop, ForeachLoopStatement);
        CASE(WhileLoop, WhileLoopStatement);
        CASE(DoWhileLoop, DoWhileLoopStatement);
        CASE(ForeverLoop, ForeverLoopStatement);
        CASE(Timed, TimedStatement);
        CASE(ImmediateAssertion, ImmediateAssertionStatement);
        CASE(ConcurrentAssertion, ConcurrentAssertionStatement);
        CASE(DisableFork, DisableForkStatement);
        CASE(Wait, WaitStatement);
        CASE(WaitFork, WaitForkStatement);
        CASE(WaitOrder, WaitOrderStatement);
        CASE(EventTrigger, EventTriggerStatement);
        CASE(ProceduralAssign, ProceduralAssignStatement);
        CASE(ProceduralDeassign, ProceduralDeassignStatement);
        CASE(RandCase, RandCaseStatement);
        CASE(RandSequence, RandSequenceStatement);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}